

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side3_4d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  int local_230;
  int int_tmp_result_FFWKCAA;
  int r_sign;
  double max7;
  double max6;
  double max5;
  double max4;
  int int_tmp_result;
  int Delta_sign;
  double upper_bound_1;
  double lower_bound_1;
  double max3;
  double max2;
  double max1;
  double eps;
  double r;
  double DeltaLambda2;
  double DeltaLambda1;
  double DeltaLambda0;
  double Delta;
  double b22;
  double b21;
  double b20;
  double b12;
  double b11;
  double b10;
  double b02;
  double b01;
  double b00;
  double a32;
  double a31;
  double a30;
  double a22;
  double a21;
  double a20;
  double a12;
  double q2_3_p0_3;
  double q2_2_p0_2;
  double q2_1_p0_1;
  double q2_0_p0_0;
  double a11;
  double q1_3_p0_3;
  double q1_2_p0_2;
  double q1_1_p0_1;
  double q1_0_p0_0;
  double a10;
  double q0_3_p0_3;
  double q0_2_p0_2;
  double q0_1_p0_1;
  double q0_0_p0_0;
  double l3;
  double p3_3_p0_3;
  double p3_2_p0_2;
  double p3_1_p0_1;
  double p3_0_p0_0;
  double l2;
  double p2_3_p0_3;
  double p2_2_p0_2;
  double p2_1_p0_1;
  double p2_0_p0_0;
  double l1;
  double p1_3_p0_3;
  double p1_2_p0_2;
  double p1_1_p0_1;
  double p1_0_p0_0;
  double *q1_local;
  double *q0_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p1 - *p0;
  dVar2 = p1[1] - p0[1];
  dVar3 = p1[2] - p0[2];
  dVar4 = p1[3] - p0[3];
  dVar5 = (dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 1.0;
  dVar6 = *p2 - *p0;
  dVar7 = p2[1] - p0[1];
  dVar8 = p2[2] - p0[2];
  dVar9 = p2[3] - p0[3];
  dVar10 = (dVar9 * dVar9 + dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7) * 1.0;
  dVar11 = *p3 - *p0;
  dVar12 = p3[1] - p0[1];
  dVar13 = p3[2] - p0[2];
  dVar14 = p3[3] - p0[3];
  dVar15 = *q0 - *p0;
  dVar16 = q0[1] - p0[1];
  dVar17 = q0[2] - p0[2];
  dVar18 = q0[3] - p0[3];
  dVar19 = (dVar4 * dVar18 + dVar3 * dVar17 + dVar1 * dVar15 + dVar2 * dVar16) * 2.0;
  dVar20 = *q1 - *p0;
  dVar21 = q1[1] - p0[1];
  dVar22 = q1[2] - p0[2];
  dVar23 = q1[3] - p0[3];
  dVar24 = (dVar4 * dVar23 + dVar3 * dVar22 + dVar1 * dVar20 + dVar2 * dVar21) * 2.0;
  dVar25 = *q2 - *p0;
  dVar26 = q2[1] - p0[1];
  dVar27 = q2[2] - p0[2];
  dVar28 = q2[3] - p0[3];
  dVar29 = (dVar4 * dVar28 + dVar3 * dVar27 + dVar1 * dVar25 + dVar2 * dVar26) * 2.0;
  dVar30 = (dVar9 * dVar18 + dVar8 * dVar17 + dVar6 * dVar15 + dVar7 * dVar16) * 2.0;
  dVar31 = (dVar9 * dVar23 + dVar8 * dVar22 + dVar6 * dVar20 + dVar7 * dVar21) * 2.0;
  dVar32 = (dVar9 * dVar28 + dVar8 * dVar27 + dVar6 * dVar25 + dVar7 * dVar26) * 2.0;
  dVar33 = dVar24 * dVar32 + -(dVar29 * dVar31);
  dVar34 = dVar29 * dVar30 + -(dVar19 * dVar32);
  dVar35 = dVar19 * dVar31 + -(dVar24 * dVar30);
  dVar36 = dVar33 + dVar34 + dVar35;
  dVar5 = dVar36 * (dVar14 * dVar14 + dVar13 * dVar13 + dVar11 * dVar11 + dVar12 * dVar12) * 1.0 +
          -((dVar14 * dVar28 + dVar13 * dVar27 + dVar11 * dVar25 + dVar12 * dVar26) * 2.0 *
            ((dVar30 - dVar31) * dVar5 + (dVar24 - dVar19) * dVar10 + dVar35) +
           (dVar14 * dVar18 + dVar13 * dVar17 + dVar11 * dVar15 + dVar12 * dVar16) * 2.0 *
           ((dVar31 - dVar32) * dVar5 + (dVar29 - dVar24) * dVar10 + dVar33) +
           (dVar14 * dVar23 + dVar13 * dVar22 + dVar11 * dVar20 + dVar12 * dVar21) * 2.0 *
           ((dVar32 - dVar30) * dVar5 + (dVar19 - dVar29) * dVar10 + dVar34));
  max2 = ABS(dVar4);
  if (max2 < ABS(dVar2)) {
    max2 = ABS(dVar2);
  }
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar1)) {
    max2 = ABS(dVar1);
  }
  max3 = ABS(dVar9);
  if (max3 < ABS(dVar8)) {
    max3 = ABS(dVar8);
  }
  if (max3 < ABS(dVar6)) {
    max3 = ABS(dVar6);
  }
  if (max3 < ABS(dVar7)) {
    max3 = ABS(dVar7);
  }
  lower_bound_1 = ABS(dVar16);
  if (lower_bound_1 < ABS(dVar15)) {
    lower_bound_1 = ABS(dVar15);
  }
  if (lower_bound_1 < ABS(dVar17)) {
    lower_bound_1 = ABS(dVar17);
  }
  if (lower_bound_1 < ABS(dVar18)) {
    lower_bound_1 = ABS(dVar18);
  }
  if (lower_bound_1 < ABS(dVar20)) {
    lower_bound_1 = ABS(dVar20);
  }
  if (lower_bound_1 < ABS(dVar21)) {
    lower_bound_1 = ABS(dVar21);
  }
  if (lower_bound_1 < ABS(dVar22)) {
    lower_bound_1 = ABS(dVar22);
  }
  if (lower_bound_1 < ABS(dVar23)) {
    lower_bound_1 = ABS(dVar23);
  }
  if (lower_bound_1 < ABS(dVar25)) {
    lower_bound_1 = ABS(dVar25);
  }
  if (lower_bound_1 < ABS(dVar26)) {
    lower_bound_1 = ABS(dVar26);
  }
  if (lower_bound_1 < ABS(dVar27)) {
    lower_bound_1 = ABS(dVar27);
  }
  if (lower_bound_1 < ABS(dVar28)) {
    lower_bound_1 = ABS(dVar28);
  }
  upper_bound_1 = max2;
  _int_tmp_result = max2;
  if (max2 <= max3) {
    if (max2 < max3) {
      _int_tmp_result = max3;
    }
  }
  else {
    upper_bound_1 = max3;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (_int_tmp_result < lower_bound_1) {
      _int_tmp_result = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (1.895283954029418e-74 <= upper_bound_1) {
    if (_int_tmp_result <= 1.2980742146337065e+33) {
      dVar1 = max2 * lower_bound_1 * max3 * lower_bound_1 * 1.7244368241093199e-13;
      if (dVar36 <= dVar1) {
        if (-dVar1 <= dVar36) {
          return 0;
        }
        max4._0_4_ = -1;
      }
      else {
        max4._0_4_ = 1;
      }
      max5 = max2;
      max6 = max2;
      max7 = max2;
      if (max2 < ABS(dVar11)) {
        max7 = ABS(dVar11);
      }
      if (max7 < ABS(dVar14)) {
        max7 = ABS(dVar14);
      }
      if (max7 < ABS(dVar13)) {
        max7 = ABS(dVar13);
      }
      if (max7 < ABS(dVar12)) {
        max7 = ABS(dVar12);
      }
      if (max2 < max7) {
        max6 = max7;
      }
      if (max6 < lower_bound_1) {
        max6 = lower_bound_1;
      }
      _int_tmp_result_FFWKCAA = max2;
      if (max2 < lower_bound_1) {
        _int_tmp_result_FFWKCAA = lower_bound_1;
      }
      if (max6 < _int_tmp_result_FFWKCAA) {
        max6 = _int_tmp_result_FFWKCAA;
      }
      if (max2 < max6) {
        max5 = max6;
      }
      if (max5 < max7) {
        max5 = max7;
      }
      if (max5 < max3) {
        max5 = max3;
      }
      if (max5 < lower_bound_1) {
        max5 = lower_bound_1;
      }
      if (max5 < _int_tmp_result_FFWKCAA) {
        max5 = _int_tmp_result_FFWKCAA;
      }
      upper_bound_1 = max6;
      _int_tmp_result = max6;
      if (max7 < max6) {
        upper_bound_1 = max7;
      }
      if (max3 < upper_bound_1) {
        upper_bound_1 = max3;
      }
      if (lower_bound_1 < upper_bound_1) {
        upper_bound_1 = lower_bound_1;
      }
      if (upper_bound_1 <= max5) {
        if (max6 < max5) {
          _int_tmp_result = max5;
        }
      }
      else {
        upper_bound_1 = max5;
      }
      if (_int_tmp_result_FFWKCAA < upper_bound_1) {
        upper_bound_1 = _int_tmp_result_FFWKCAA;
      }
      if (4.1460764440172624e-50 <= upper_bound_1) {
        if (_int_tmp_result <= 1.2980742146337065e+33) {
          dVar1 = max7 * lower_bound_1 * max3 * _int_tmp_result_FFWKCAA * max6 * max5 *
                  4.380468888011788e-12;
          if (dVar5 <= dVar1) {
            if (-dVar1 <= dVar5) {
              return 0;
            }
            local_230 = -1;
          }
          else {
            local_230 = 1;
          }
          p0_local._4_4_ = max4._0_4_ * local_230;
        }
        else {
          p0_local._4_4_ = 0;
        }
      }
      else {
        p0_local._4_4_ = 0;
      }
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side3_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double l1;
    l1 = (1 * ((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double l2;
    l2 = (1 * ((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double l3;
    l3 = (1 * ((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double a10;
    a10 = (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double a11;
    a11 = (2 * ((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double a12;
    a12 = (2 * ((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)));
    double a20;
    a20 = (2 * ((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)));
    double a21;
    a21 = (2 * ((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)));
    double a22;
    a22 = (2 * ((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)));
    double a30;
    a30 = (2 * ((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)));
    double a31;
    a31 = (2 * ((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)));
    double a32;
    a32 = (2 * ((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_3_p0_3);
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_3_p0_3);
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_0_p0_0)) )
    {
        max2 = fabs(p2_0_p0_0);
    } 
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    double max3 = fabs(q0_1_p0_1);
    if( (max3 < fabs(q0_0_p0_0)) )
    {
        max3 = fabs(q0_0_p0_0);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.89528395402941802921e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.72443682410931985179e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    double max5 = max1;
    double max6 = max1;
    if( (max6 < fabs(p3_0_p0_0)) )
    {
        max6 = fabs(p3_0_p0_0);
    } 
    if( (max6 < fabs(p3_3_p0_3)) )
    {
        max6 = fabs(p3_3_p0_3);
    } 
    if( (max6 < fabs(p3_2_p0_2)) )
    {
        max6 = fabs(p3_2_p0_2);
    } 
    if( (max6 < fabs(p3_1_p0_1)) )
    {
        max6 = fabs(p3_1_p0_1);
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max5;
    upper_bound_1 = max5;
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 4.14607644401726239868e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.38046888801178809320e-12 * (((((max6 * max3) * max2) * max7) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}